

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O0

void get_vault_monsters(chunk *c,char *racial_symbol,char *vault_type,char *data,wchar_t y1,
                       wchar_t y2,wchar_t x1,wchar_t x2)

{
  char *pcVar1;
  monster_race *pmVar2;
  loc_conflict grid;
  char *local_48;
  char *t;
  wchar_t depth;
  wchar_t x;
  wchar_t y;
  wchar_t i;
  wchar_t y2_local;
  wchar_t y1_local;
  char *data_local;
  char *vault_type_local;
  char *racial_symbol_local;
  chunk *c_local;
  
  for (x = L'\0'; racial_symbol[x] != '\0'; x = x + L'\x01') {
    allow_unique = true;
    pcVar1 = format("%c",(ulong)(uint)(int)racial_symbol[x]);
    my_strcpy(base_d_char,pcVar1,0xf);
    select_current_level = c->depth;
    pcVar1 = strstr(vault_type,"Lesser vault");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strstr(vault_type,"Medium vault");
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strstr(vault_type,"Greater vault");
        if (pcVar1 == (char *)0x0) {
          t._0_4_ = c->depth;
        }
        else {
          t._0_4_ = c->depth + L'\x06';
        }
      }
      else {
        t._0_4_ = c->depth + L'\x04';
      }
    }
    else {
      t._0_4_ = c->depth + L'\x02';
    }
    get_mon_num_prep(mon_select);
    pmVar2 = get_mon_num((wchar_t)t,c->depth);
    local_48 = data;
    depth = y1;
    if (pmVar2 != (monster_race *)0x0) {
      for (; depth <= y2; depth = depth + L'\x01') {
        for (t._4_4_ = x1; t._4_4_ <= x2; t._4_4_ = t._4_4_ + L'\x01') {
          if (*local_48 == racial_symbol[x]) {
            grid = (loc_conflict)loc(t._4_4_,depth);
            pick_and_place_monster(c,grid,(wchar_t)t,false,false,'\v');
          }
          local_48 = local_48 + 1;
        }
      }
    }
  }
  get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
  return;
}

Assistant:

void get_vault_monsters(struct chunk *c, char racial_symbol[], char *vault_type,
						const char *data, int y1, int y2, int x1, int x2)
{
	int i, y, x, depth;
	const char *t;

	for (i = 0; racial_symbol[i] != '\0'; i++) {
		/* Require correct race, allow uniques. */
		allow_unique = true;
		my_strcpy(base_d_char, format("%c", racial_symbol[i]),
			sizeof(base_d_char));
		select_current_level = c->depth;

		/* Determine level of monster */
		if (strstr(vault_type, "Lesser vault"))
			depth = c->depth + 2;
		else if (strstr(vault_type, "Medium vault"))
			depth = c->depth + 4;
		else if (strstr(vault_type, "Greater vault"))
			depth = c->depth + 6;
		else
			depth = c->depth;

		/* Prepare allocation table */
		get_mon_num_prep(mon_select);

		/* Build the monster probability table. */
		if (!get_mon_num(depth, c->depth))
			continue;


		/* Place the monsters */
		for (t = data, y = y1; y <= y2; y++) {
			for (x = x1; x <= x2; x++, t++) {
				if (*t == racial_symbol[i]) {
					/* Place a monster */
					pick_and_place_monster(c, loc(x, y), depth, false,
																false, ORIGIN_DROP_SPECIAL);
				}
			}
		}
	}

	/* Clear any current monster restrictions. */
	get_mon_num_prep(NULL);
}